

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonDocument.cpp
# Opt level: O0

JsonDocument __thiscall json::JsonDocument::createFromStream(JsonDocument *this,istream *input)

{
  ulong uVar1;
  runtime_error *this_00;
  unique_ptr<json::JsonNode,_std::default_delete<json::JsonNode>_> local_38;
  unique_ptr<json::JsonNode,_std::default_delete<json::JsonNode>_> local_30;
  unique_ptr<json::JsonNode,_std::default_delete<json::JsonNode>_> root;
  istream *input_local;
  
  uVar1 = std::ios::good();
  if ((uVar1 & 1) == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"The input stream was bad");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  JsonParser::parse((JsonParser *)&local_30,input);
  std::unique_ptr<json::JsonNode,_std::default_delete<json::JsonNode>_>::unique_ptr
            (&local_38,&local_30);
  JsonDocument(this,&local_38);
  std::unique_ptr<json::JsonNode,_std::default_delete<json::JsonNode>_>::~unique_ptr(&local_38);
  std::unique_ptr<json::JsonNode,_std::default_delete<json::JsonNode>_>::~unique_ptr(&local_30);
  return (unique_ptr<json::JsonNode,_std::default_delete<json::JsonNode>_>)
         (unique_ptr<json::JsonNode,_std::default_delete<json::JsonNode>_>)this;
}

Assistant:

JsonDocument JsonDocument::createFromStream(std::istream &input)
    {
        if (!input.good())
            throw std::runtime_error("The input stream was bad");
        std::unique_ptr<JsonNode> root = JsonParser::parse(input);
        return JsonDocument(std::move(root));
    }